

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O1

void __thiscall Movegen::generate<(Movetype)11,(Piece)6>(Movegen *this)

{
  Square *pSVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  U64 UVar6;
  U64 UVar7;
  Square *pSVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  U8 *pUVar12;
  Square SVar13;
  
  uVar4 = this->check_target;
  if (uVar4 == 0) {
    generate<(Movetype)16,(Piece)0>(this);
    generate<(Movetype)11,(Piece)0>(this);
    pSVar8 = this->knights;
    SVar13 = *pSVar8;
    if (SVar13 != no_square) {
      iVar9 = this->last;
      uVar4 = this->ctarget;
      do {
        uVar11 = (&bitboards::nmask)[SVar13] & uVar4;
        if (uVar11 != 0) {
          pUVar12 = &this->list[iVar9].type;
          do {
            lVar5 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            iVar9 = iVar9 + 1;
            uVar11 = uVar11 & uVar11 - 1;
          } while (uVar11 != 0);
          this->last = iVar9;
        }
        SVar13 = pSVar8[1];
        pSVar8 = pSVar8 + 1;
      } while (SVar13 != no_square);
    }
    pSVar8 = this->bishops;
    if (*pSVar8 != no_square) {
      do {
        UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        uVar4 = UVar6 & this->ctarget;
        if (uVar4 != 0) {
          SVar13 = *pSVar8;
          uVar11 = (ulong)this->last;
          pUVar12 = &this->list[uVar11].type;
          do {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (char)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            uVar4 = uVar4 & uVar4 - 1;
          } while (uVar4 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->rooks;
    if (*pSVar8 != no_square) {
      do {
        UVar6 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar4 = UVar6 & this->ctarget;
        if (uVar4 != 0) {
          SVar13 = *pSVar8;
          uVar11 = (ulong)this->last;
          pUVar12 = &this->list[uVar11].type;
          do {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (char)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            uVar4 = uVar4 & uVar4 - 1;
          } while (uVar4 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    pSVar8 = this->queens;
    if (*pSVar8 != no_square) {
      do {
        UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
        UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
        uVar4 = (UVar7 | UVar6) & this->ctarget;
        if (uVar4 != 0) {
          SVar13 = *pSVar8;
          uVar11 = (ulong)this->last;
          pUVar12 = &this->list[uVar11].type;
          do {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (char)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            uVar4 = uVar4 & uVar4 - 1;
          } while (uVar4 != 0);
          this->last = uVar10;
        }
        pSVar1 = pSVar8 + 1;
        pSVar8 = pSVar8 + 1;
      } while (*pSVar1 != no_square);
    }
    SVar13 = *this->kings;
    uVar4 = this->enemies & (&bitboards::kmask)[SVar13];
    if (uVar4 == 0) {
      return;
    }
    lVar5 = (long)this->last;
    pUVar12 = &this->list[lVar5].type;
    do {
      lVar5 = lVar5 + 1;
      iVar9 = (int)lVar5;
      lVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
      pUVar12[-1] = (U8)lVar2;
      *pUVar12 = '\v';
      pUVar12 = pUVar12 + 3;
      uVar4 = uVar4 & uVar4 - 1;
    } while (uVar4 != 0);
  }
  else {
    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
    bVar3 = (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    if (this->evasion_target == 0) {
      if (bVar3 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        SVar13 = *this->kings;
        uVar4 = this->enemies & (&bitboards::kmask)[SVar13];
        if (uVar4 != 0) {
          uVar11 = (ulong)this->last;
          pUVar12 = &this->list[uVar11].type;
          do {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            uVar4 = uVar4 & uVar4 - 1;
          } while (uVar4 != 0);
          this->last = uVar10;
        }
        generate<(Movetype)11,(Piece)0>(this);
        pSVar8 = this->knights;
        SVar13 = *pSVar8;
        if (SVar13 != no_square) {
          iVar9 = this->last;
          uVar4 = this->ctarget;
          do {
            uVar11 = (&bitboards::nmask)[SVar13] & uVar4;
            if (uVar11 != 0) {
              pUVar12 = &this->list[iVar9].type;
              do {
                lVar5 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                iVar9 = iVar9 + 1;
                uVar11 = uVar11 & uVar11 - 1;
              } while (uVar11 != 0);
              this->last = iVar9;
            }
            SVar13 = pSVar8[1];
            pSVar8 = pSVar8 + 1;
          } while (SVar13 != no_square);
        }
        pSVar8 = this->bishops;
        if (*pSVar8 != no_square) {
          do {
            UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            uVar4 = UVar6 & this->ctarget;
            if (uVar4 != 0) {
              SVar13 = *pSVar8;
              uVar11 = (ulong)this->last;
              pUVar12 = &this->list[uVar11].type;
              do {
                lVar5 = 0;
                if (uVar4 != 0) {
                  for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (char)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
                uVar4 = uVar4 & uVar4 - 1;
              } while (uVar4 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->rooks;
        if (*pSVar8 != no_square) {
          do {
            UVar6 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar4 = UVar6 & this->ctarget;
            if (uVar4 != 0) {
              SVar13 = *pSVar8;
              uVar11 = (ulong)this->last;
              pUVar12 = &this->list[uVar11].type;
              do {
                lVar5 = 0;
                if (uVar4 != 0) {
                  for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (char)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
                uVar4 = uVar4 & uVar4 - 1;
              } while (uVar4 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->queens;
        if (*pSVar8 == no_square) {
          return;
        }
        do {
          UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
          UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
          uVar4 = (UVar7 | UVar6) & this->ctarget;
          if (uVar4 != 0) {
            SVar13 = *pSVar8;
            uVar11 = (ulong)this->last;
            pUVar12 = &this->list[uVar11].type;
            do {
              lVar5 = 0;
              if (uVar4 != 0) {
                for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              ((Move *)(pUVar12 + -2))->f = (char)SVar13;
              pUVar12[-1] = (U8)lVar5;
              *pUVar12 = '\v';
              pUVar12 = pUVar12 + 3;
              uVar10 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar10;
              uVar4 = uVar4 & uVar4 - 1;
            } while (uVar4 != 0);
            this->last = uVar10;
          }
          pSVar1 = pSVar8 + 1;
          pSVar8 = pSVar8 + 1;
        } while (*pSVar1 != no_square);
        return;
      }
      SVar13 = *this->kings;
      uVar4 = this->enemies & (&bitboards::kmask)[SVar13];
      if (uVar4 == 0) {
        return;
      }
      lVar5 = (long)this->last;
      pUVar12 = &this->list[lVar5].type;
      do {
        lVar5 = lVar5 + 1;
        iVar9 = (int)lVar5;
        lVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
        pUVar12[-1] = (U8)lVar2;
        *pUVar12 = '\v';
        pUVar12 = pUVar12 + 3;
        uVar4 = uVar4 & uVar4 - 1;
      } while (uVar4 != 0);
    }
    else {
      if (bVar3 < 2) {
        generate<(Movetype)16,(Piece)0>(this);
        generate<(Movetype)11,(Piece)0>(this);
        SVar13 = *this->kings;
        uVar4 = this->enemies & (&bitboards::kmask)[SVar13];
        if (uVar4 != 0) {
          uVar11 = (ulong)this->last;
          pUVar12 = &this->list[uVar11].type;
          do {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
            pUVar12[-1] = (U8)lVar5;
            *pUVar12 = '\v';
            pUVar12 = pUVar12 + 3;
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
            uVar4 = uVar4 & uVar4 - 1;
          } while (uVar4 != 0);
          this->last = uVar10;
        }
        pSVar8 = this->knights;
        SVar13 = *pSVar8;
        if (SVar13 != no_square) {
          iVar9 = this->last;
          uVar4 = this->ctarget;
          do {
            uVar11 = (&bitboards::nmask)[SVar13] & uVar4;
            if (uVar11 != 0) {
              pUVar12 = &this->list[iVar9].type;
              do {
                lVar5 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                iVar9 = iVar9 + 1;
                uVar11 = uVar11 & uVar11 - 1;
              } while (uVar11 != 0);
              this->last = iVar9;
            }
            SVar13 = pSVar8[1];
            pSVar8 = pSVar8 + 1;
          } while (SVar13 != no_square);
        }
        pSVar8 = this->bishops;
        if (*pSVar8 != no_square) {
          do {
            UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
            uVar4 = UVar6 & this->ctarget;
            if (uVar4 != 0) {
              SVar13 = *pSVar8;
              uVar11 = (ulong)this->last;
              pUVar12 = &this->list[uVar11].type;
              do {
                lVar5 = 0;
                if (uVar4 != 0) {
                  for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (char)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
                uVar4 = uVar4 & uVar4 - 1;
              } while (uVar4 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->rooks;
        if (*pSVar8 != no_square) {
          do {
            UVar6 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
            uVar4 = UVar6 & this->ctarget;
            if (uVar4 != 0) {
              SVar13 = *pSVar8;
              uVar11 = (ulong)this->last;
              pUVar12 = &this->list[uVar11].type;
              do {
                lVar5 = 0;
                if (uVar4 != 0) {
                  for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                ((Move *)(pUVar12 + -2))->f = (char)SVar13;
                pUVar12[-1] = (U8)lVar5;
                *pUVar12 = '\v';
                pUVar12 = pUVar12 + 3;
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
                uVar4 = uVar4 & uVar4 - 1;
              } while (uVar4 != 0);
              this->last = uVar10;
            }
            pSVar1 = pSVar8 + 1;
            pSVar8 = pSVar8 + 1;
          } while (*pSVar1 != no_square);
        }
        pSVar8 = this->queens;
        if (*pSVar8 == no_square) {
          return;
        }
        do {
          UVar6 = magics::attacks<(Piece)2>(&this->all_pieces,pSVar8);
          UVar7 = magics::attacks<(Piece)3>(&this->all_pieces,pSVar8);
          uVar4 = (UVar7 | UVar6) & this->ctarget;
          if (uVar4 != 0) {
            SVar13 = *pSVar8;
            uVar11 = (ulong)this->last;
            pUVar12 = &this->list[uVar11].type;
            do {
              lVar5 = 0;
              if (uVar4 != 0) {
                for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              ((Move *)(pUVar12 + -2))->f = (char)SVar13;
              pUVar12[-1] = (U8)lVar5;
              *pUVar12 = '\v';
              pUVar12 = pUVar12 + 3;
              uVar10 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar10;
              uVar4 = uVar4 & uVar4 - 1;
            } while (uVar4 != 0);
            this->last = uVar10;
          }
          pSVar1 = pSVar8 + 1;
          pSVar8 = pSVar8 + 1;
        } while (*pSVar1 != no_square);
        return;
      }
      SVar13 = *this->kings;
      uVar4 = this->enemies & (&bitboards::kmask)[SVar13];
      if (uVar4 == 0) {
        return;
      }
      lVar5 = (long)this->last;
      pUVar12 = &this->list[lVar5].type;
      do {
        lVar5 = lVar5 + 1;
        iVar9 = (int)lVar5;
        lVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        ((Move *)(pUVar12 + -2))->f = (U8)SVar13;
        pUVar12[-1] = (U8)lVar2;
        *pUVar12 = '\v';
        pUVar12 = pUVar12 + 3;
        uVar4 = uVar4 & uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  this->last = iVar9;
  return;
}

Assistant:

inline void Movegen::generate<capture, pieces>() {
	// todo: order move generation by game phase
	// data-driven approach for this?
	if (check_target == 0ULL) {
		generate<capture_promotion, pawn>();
		generate<capture, pawn>();
		generate<capture, knight>();
		generate<capture, bishop>();
		generate<capture, rook>();
		generate<capture, queen>();
		generate<capture, king>();
	}
	else if (check_target != 0ULL && evasion_target == 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, king>();
			generate<capture, pawn>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
		}
		else {
			generate<capture, king>();
		}
	}
	else if (check_target != 0ULL && evasion_target != 0ULL) {
		if (!bits::more_than_one(check_target)) {
			generate<capture_promotion, pawn>();
			generate<capture, pawn>();
			generate<capture, king>();
			generate<capture, knight>();
			generate<capture, bishop>();
			generate<capture, rook>();
			generate<capture, queen>();
		}
		else {
			generate<capture, king>();
		}
	}
}